

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Ptr * wabt::interp::Instance::Instantiate
                (Ptr *__return_storage_ptr__,Store *store,Ref module,RefVec *imports,Ptr *out_trap)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pFVar3;
  size_t sVar4;
  pointer pTVar5;
  pointer pMVar6;
  pointer pGVar7;
  pointer pEVar8;
  pointer pEVar9;
  Func *pFVar10;
  pointer pEVar11;
  ElemDesc *pEVar12;
  pointer pDVar13;
  DataDesc *pDVar14;
  pointer pSVar15;
  undefined8 uVar16;
  Instance *pIVar17;
  int iVar18;
  Result RVar19;
  Ref *pRVar20;
  pointer pRVar21;
  ulong uVar22;
  pointer pEVar23;
  pointer src;
  FuncDesc *desc;
  pointer pFVar24;
  pointer pTVar25;
  pointer pMVar26;
  pointer pGVar27;
  Ptr *out_trap_00;
  iterator iVar28;
  Store *store_00;
  ulong uVar29;
  vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *this;
  ulong uVar30;
  ElemDesc *desc_5;
  long lVar31;
  Func *pFVar32;
  long lVar33;
  ulong uVar34;
  pointer pSVar35;
  ExportDesc *desc_4;
  pointer pEVar36;
  pointer pDVar37;
  Value VVar38;
  Ptr extern_;
  Ptr table;
  Ptr inst;
  Ptr mod;
  Ref extern_ref;
  undefined1 local_208 [32];
  Value local_1e8;
  Index local_1d8;
  RefPtr<wabt::interp::Instance> local_1c8;
  Ptr *local_1a8;
  RefVec *local_1a0;
  RefPtr<wabt::interp::Module> local_198;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_178;
  Ptr *local_158;
  Store *local_150;
  RefPtr<wabt::interp::Trap> local_148;
  long local_130;
  GlobalType local_128;
  EventType local_110;
  MemoryType local_e8;
  TableType local_c0;
  FuncDesc local_98;
  Ref local_38;
  
  local_1a8 = __return_storage_ptr__;
  local_38.index = module.index;
  RefPtr<wabt::interp::Module>::RefPtr(&local_198,store,module);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            (&local_1c8,store,store,&local_38);
  pIVar1 = ((local_198.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = ((local_198.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar29 = ((long)pIVar2 - (long)pIVar1 >> 3) * -0x71c71c71c71c71c7;
  local_1a0 = imports;
  if ((ulong)((long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar29) {
    local_208._0_8_ = local_208 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"not enough imports!","");
    local_148.root_index_ = 0;
    local_148.obj_ = (Trap *)0x0;
    local_148.store_ = (Store *)0x0;
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              ((RefPtr<wabt::interp::Trap> *)&local_1e8.v128_,store,store,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
               (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_148);
    out_trap->obj_ = (Trap *)local_1e8.i64_;
    out_trap->store_ = (Store *)local_1e8._8_8_;
    out_trap->root_index_ = local_1d8;
    local_1d8 = 0;
    local_1e8 = (Value)ZEXT816(0);
    if (local_148.obj_ != (Trap *)0x0) {
      operator_delete(local_148.obj_);
    }
LAB_00246a76:
    if ((Func *)local_208._0_8_ != (Func *)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_);
    }
    local_1a8->obj_ = (Instance *)0x0;
    local_1a8->store_ = (Store *)0x0;
    local_1a8->root_index_ = 0;
  }
  else {
    if (pIVar2 != pIVar1) {
      local_130 = uVar29 + (uVar29 == 0);
      lVar33 = 0;
      lVar31 = 0;
      do {
        pIVar1 = ((local_198.obj_)->desc_).imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_178.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(local_1a0->
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar31].index;
        if (local_178.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          StringPrintf_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     "invalid import \"%s.%s\"",
                     *(undefined8 *)((long)&(pIVar1->type).module._M_dataplus + lVar33),
                     *(undefined8 *)((long)&(pIVar1->type).name._M_dataplus + lVar33));
          local_148.root_index_ = 0;
          local_148.obj_ = (Trap *)0x0;
          local_148.store_ = (Store *)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    ((RefPtr<wabt::interp::Trap> *)&local_1e8.v128_,store,store,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_148
                    );
          out_trap->obj_ = (Trap *)local_1e8.i64_;
          out_trap->store_ = (Store *)local_1e8._8_8_;
          out_trap->root_index_ = local_1d8;
          local_1d8 = 0;
          local_1e8 = (Value)ZEXT816(0);
          if (local_148.obj_ != (Trap *)0x0) {
            operator_delete(local_148.obj_);
          }
          goto LAB_00246a76;
        }
        RefPtr<wabt::interp::Extern>::RefPtr
                  ((RefPtr<wabt::interp::Extern> *)local_208,store,
                   (Ref)local_178.
                        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        iVar18 = (**(code **)(*(long *)local_208._0_8_ + 0x18))
                           (local_208._0_8_,store,(long)&(pIVar1->type).module._M_dataplus + lVar33,
                            out_trap);
        if (iVar18 == 1) {
          local_1a8->obj_ = (Instance *)0x0;
          local_1a8->store_ = (Store *)0x0;
          local_1a8->root_index_ = 0;
        }
        else {
          iVar28._M_current =
               ((local_1c8.obj_)->imports_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar28._M_current ==
              ((local_1c8.obj_)->imports_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
            _M_realloc_insert<wabt::interp::Ref_const&>
                      ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                       &(local_1c8.obj_)->imports_,iVar28,(Ref *)&local_178);
          }
          else {
            (iVar28._M_current)->index =
                 (size_t)local_178.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->imports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
          }
          switch(*(undefined4 *)(*(long *)((long)&(pIVar1->type).type._M_t + lVar33) + 8)) {
          case 0:
            iVar28._M_current =
                 ((local_1c8.obj_)->funcs_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->funcs_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->funcs_;
LAB_00246c98:
              std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
              _M_realloc_insert<wabt::interp::Ref_const&>(this,iVar28,(Ref *)&local_178);
            }
            else {
              (iVar28._M_current)->index =
                   (size_t)local_178.
                           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              ((local_1c8.obj_)->funcs_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar28._M_current + 1;
            }
            break;
          case 1:
            iVar28._M_current =
                 ((local_1c8.obj_)->tables_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->tables_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->tables_;
              goto LAB_00246c98;
            }
            (iVar28._M_current)->index =
                 (size_t)local_178.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->tables_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
            break;
          case 2:
            iVar28._M_current =
                 ((local_1c8.obj_)->memories_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->memories_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->memories_;
              goto LAB_00246c98;
            }
            (iVar28._M_current)->index =
                 (size_t)local_178.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->memories_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
            break;
          case 3:
            iVar28._M_current =
                 ((local_1c8.obj_)->globals_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->globals_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->globals_;
              goto LAB_00246c98;
            }
            (iVar28._M_current)->index =
                 (size_t)local_178.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
            break;
          case 4:
            iVar28._M_current =
                 ((local_1c8.obj_)->events_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->events_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->events_;
              goto LAB_00246c98;
            }
            (iVar28._M_current)->index =
                 (size_t)local_178.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->events_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
          }
        }
        if ((Func *)local_208._0_8_ != (Func *)0x0) {
          FreeList<wabt::interp::Ref>::Delete((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_)
          ;
          local_208._0_8_ = (Func *)0x0;
          local_208._8_8_ = (Store *)0x0;
          local_208._16_8_ = 0;
        }
        if (iVar18 == 1) goto LAB_002479b6;
        lVar31 = lVar31 + 1;
        lVar33 = lVar33 + 0x48;
      } while (local_130 != lVar31);
    }
    pFVar24 = ((local_198.obj_)->desc_).funcs.
              super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pFVar3 = ((local_198.obj_)->desc_).funcs.
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_158 = out_trap;
    if (pFVar24 != pFVar3) {
      do {
        pIVar17 = local_1c8.obj_;
        pRVar20 = (Ref *)&Ref::Null;
        if (local_1c8.store_ != (Store *)0x0) {
          pRVar20 = FreeList<wabt::interp::Ref>::Get
                              (&(local_1c8.store_)->roots_,local_1c8.root_index_);
        }
        sVar4 = pRVar20->index;
        local_98.type.super_ExternType.kind = (pFVar24->type).super_ExternType.kind;
        local_98.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_002cfb50;
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_98.type.params,&(pFVar24->type).params);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_98.type.results,&(pFVar24->type).results);
        std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                  (&local_98.locals,&pFVar24->locals);
        local_98.code_offset = pFVar24->code_offset;
        local_1e8.i64_ = sVar4;
        Store::
        Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                  ((RefPtr<wabt::interp::DefinedFunc> *)local_208,store,store,&local_1e8.ref_,
                   &local_98);
        pRVar20 = (Ref *)&Ref::Null;
        if ((Store *)local_208._8_8_ != (Store *)0x0) {
          pRVar20 = FreeList<wabt::interp::Ref>::Get
                              ((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_);
        }
        local_1e8.i64_ = pRVar20->index;
        iVar28._M_current =
             (pIVar17->funcs_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar28._M_current ==
            (pIVar17->funcs_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar17->funcs_,iVar28,&local_1e8.ref_);
        }
        else {
          (iVar28._M_current)->index = pRVar20->index;
          (pIVar17->funcs_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar28._M_current + 1;
        }
        if ((Func *)local_208._0_8_ != (Func *)0x0) {
          FreeList<wabt::interp::Ref>::Delete((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_)
          ;
          local_208._0_8_ = (Func *)0x0;
          local_208._8_8_ = (Store *)0x0;
          local_208._16_8_ = 0;
        }
        if (local_98.locals.
            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.locals.
                          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        local_98.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_002cfb50;
        if (local_98.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.type.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_98.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.type.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        pFVar24 = pFVar24 + 1;
      } while (pFVar24 != pFVar3);
    }
    pTVar5 = ((local_198.obj_)->desc_).tables.
             super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar17 = local_1c8.obj_;
    for (pTVar25 = ((local_198.obj_)->desc_).tables.
                   super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pTVar25 != pTVar5;
        pTVar25 = pTVar25 + 1) {
      local_c0.super_ExternType.kind = (pTVar25->type).super_ExternType.kind;
      local_c0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002cfb90;
      local_c0.limits._12_6_ =
           SUB86((ulong)*(undefined8 *)((long)&(pTVar25->type).limits.max + 2) >> 0x10,0);
      local_c0._12_8_ = *(undefined8 *)&(pTVar25->type).super_ExternType.field_0xc;
      uVar16 = *(undefined8 *)((long)&(pTVar25->type).limits.initial + 4);
      local_c0.limits._4_6_ = SUB86(uVar16,0);
      local_c0.limits.max._2_2_ = (undefined2)((ulong)uVar16 >> 0x30);
      local_1c8.obj_ = pIVar17;
      Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
                ((RefPtr<wabt::interp::Table> *)local_208,store,store,&local_c0);
      pRVar20 = (Ref *)&Ref::Null;
      if ((Store *)local_208._8_8_ != (Store *)0x0) {
        pRVar20 = FreeList<wabt::interp::Ref>::Get
                            ((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_);
      }
      local_1e8.i64_ = pRVar20->index;
      iVar28._M_current =
           (pIVar17->tables_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar28._M_current ==
          (pIVar17->tables_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar17->tables_,iVar28,&local_1e8.ref_);
      }
      else {
        (iVar28._M_current)->index = pRVar20->index;
        (pIVar17->tables_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar28._M_current + 1;
      }
      if ((Func *)local_208._0_8_ != (Func *)0x0) {
        FreeList<wabt::interp::Ref>::Delete((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_);
        local_208._0_8_ = (Func *)0x0;
        local_208._8_8_ = (Store *)0x0;
        local_208._16_8_ = 0;
      }
      pIVar17 = local_1c8.obj_;
    }
    pMVar6 = ((local_198.obj_)->desc_).memories.
             super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar26 = ((local_198.obj_)->desc_).memories.
                   super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_1c8.obj_ = pIVar17,
        pMVar26 != pMVar6; pMVar26 = pMVar26 + 1) {
      local_e8.super_ExternType.kind = (pMVar26->type).super_ExternType.kind;
      local_e8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002cfbd0;
      local_e8.limits.has_max = (pMVar26->type).limits.has_max;
      local_e8.limits.is_shared = (pMVar26->type).limits.is_shared;
      local_e8.limits._18_6_ = *(undefined6 *)&(pMVar26->type).limits.field_0x12;
      local_e8.limits.initial = (pMVar26->type).limits.initial;
      local_e8.limits.max = (pMVar26->type).limits.max;
      Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
                ((RefPtr<wabt::interp::Memory> *)local_208,store,store,&local_e8);
      pRVar20 = (Ref *)&Ref::Null;
      if ((Store *)local_208._8_8_ != (Store *)0x0) {
        pRVar20 = FreeList<wabt::interp::Ref>::Get
                            ((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_);
      }
      local_1e8.i64_ = pRVar20->index;
      iVar28._M_current =
           (pIVar17->memories_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar28._M_current ==
          (pIVar17->memories_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar17->memories_,iVar28,&local_1e8.ref_);
      }
      else {
        (iVar28._M_current)->index = pRVar20->index;
        (pIVar17->memories_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar28._M_current + 1;
      }
      if ((Func *)local_208._0_8_ != (Func *)0x0) {
        FreeList<wabt::interp::Ref>::Delete((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_);
        local_208._0_8_ = (Func *)0x0;
        local_208._8_8_ = (Store *)0x0;
        local_208._16_8_ = 0;
      }
      pIVar17 = local_1c8.obj_;
    }
    pGVar27 = ((local_198.obj_)->desc_).globals.
              super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pGVar7 = ((local_198.obj_)->desc_).globals.
             super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pGVar27 != pGVar7) {
      do {
        pIVar17 = local_1c8.obj_;
        local_128.super_ExternType.kind = (pGVar27->type).super_ExternType.kind;
        local_128.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002cfc10;
        local_128._12_8_ = *(undefined8 *)&(pGVar27->type).super_ExternType.field_0xc;
        local_1e8 = ResolveInitExpr(local_1c8.obj_,store,pGVar27->init);
        Store::
        Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
                  ((RefPtr<wabt::interp::Global> *)local_208,store,store,&local_128,&local_1e8);
        pRVar20 = (Ref *)&Ref::Null;
        if ((Store *)local_208._8_8_ != (Store *)0x0) {
          pRVar20 = FreeList<wabt::interp::Ref>::Get
                              ((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_);
        }
        local_1e8.i64_ = pRVar20->index;
        iVar28._M_current =
             (pIVar17->globals_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar28._M_current ==
            (pIVar17->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar17->globals_,iVar28,&local_1e8.ref_);
        }
        else {
          (iVar28._M_current)->index = pRVar20->index;
          (pIVar17->globals_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar28._M_current + 1;
        }
        if ((Func *)local_208._0_8_ != (Func *)0x0) {
          FreeList<wabt::interp::Ref>::Delete((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_)
          ;
          local_208._0_8_ = (Func *)0x0;
          local_208._8_8_ = (Store *)0x0;
          local_208._16_8_ = 0;
        }
        pGVar27 = pGVar27 + 1;
      } while (pGVar27 != pGVar7);
    }
    pEVar8 = ((local_198.obj_)->desc_).events.
             super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar17 = local_1c8.obj_;
    for (pEVar23 = ((local_198.obj_)->desc_).events.
                   super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_1c8.obj_ = pIVar17,
        pEVar23 != pEVar8; pEVar23 = (pointer)((long)pEVar23 + 0x28)) {
      local_110.super_ExternType.kind =
           *(ExternKind *)&((EventType *)((long)pEVar23 + 8))->super_ExternType;
      local_110.super_ExternType._vptr_ExternType = (_func_int **)&PTR__EventType_002cfc50;
      local_110.super_ExternType._12_4_ =
           *(undefined4 *)&((EventType *)((long)pEVar23 + 0xc))->super_ExternType;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_110.signature,
                 (vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)pEVar23 + 0x10));
      Store::Alloc<wabt::interp::Event,wabt::interp::Store&,wabt::interp::EventType&>
                ((RefPtr<wabt::interp::Event> *)local_208,store,store,&local_110);
      pRVar20 = (Ref *)&Ref::Null;
      if ((Store *)local_208._8_8_ != (Store *)0x0) {
        pRVar20 = FreeList<wabt::interp::Ref>::Get
                            ((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_);
      }
      local_1e8.i64_ = pRVar20->index;
      iVar28._M_current =
           *(Ref **)&((RefVec *)((long)pIVar17 + 200))->
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>;
      if (iVar28._M_current ==
          *(Ref **)&((RefVec *)((long)pIVar17 + 0xd0))->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>
                  ((RefVec *)((long)pIVar17 + 0xc0),iVar28,&local_1e8.ref_);
      }
      else {
        (iVar28._M_current)->index = pRVar20->index;
        *(Ref **)&((RefVec *)((long)pIVar17 + 200))->
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> =
             iVar28._M_current + 1;
      }
      if ((Func *)local_208._0_8_ != (Func *)0x0) {
        FreeList<wabt::interp::Ref>::Delete((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_);
        local_208._0_8_ = (Func *)0x0;
        local_208._8_8_ = (Store *)0x0;
        local_208._16_8_ = 0;
      }
      local_110.super_ExternType._vptr_ExternType = (_func_int **)&PTR__EventType_002cfc50;
      if (local_110.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.signature.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pIVar17 = local_1c8.obj_;
    }
    pEVar36 = *(pointer *)&((ModuleDesc *)((long)local_198.obj_ + 0xe8))->func_types;
    pEVar9 = *(pointer *)&((ModuleDesc *)((long)local_198.obj_ + 0xf0))->func_types;
    if (pEVar36 != pEVar9) {
      do {
        switch(((pEVar36->type).type._M_t.
                super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind) {
        case First:
          uVar29 = (ulong)pEVar36->index;
          pRVar21 = ((local_1c8.obj_)->funcs_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Table:
          uVar29 = (ulong)pEVar36->index;
          pRVar21 = ((local_1c8.obj_)->tables_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Memory:
          uVar29 = (ulong)pEVar36->index;
          pRVar21 = ((local_1c8.obj_)->memories_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Global:
          uVar29 = (ulong)pEVar36->index;
          pRVar21 = ((local_1c8.obj_)->globals_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Event:
          uVar29 = (ulong)pEVar36->index;
          pRVar21 = ((local_1c8.obj_)->events_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          goto switchD_00247361_default;
        }
        local_208._0_8_ = pRVar21[uVar29].index;
switchD_00247361_default:
        iVar28._M_current =
             ((local_1c8.obj_)->exports_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar28._M_current ==
            ((local_1c8.obj_)->exports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
          _M_realloc_insert<wabt::interp::Ref_const&>
                    ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->exports_,iVar28,(Ref *)local_208);
        }
        else {
          (iVar28._M_current)->index = local_208._0_8_;
          ((local_1c8.obj_)->exports_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar28._M_current + 1;
        }
        pEVar36 = pEVar36 + 1;
      } while (pEVar36 != pEVar9);
    }
    pFVar32 = (Func *)((local_198.obj_)->desc_).elems.
                      super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    pFVar10 = (Func *)((local_198.obj_)->desc_).elems.
                      super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar32 != pFVar10) {
      do {
        local_208._0_8_ = pFVar32;
        std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
        emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                  ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                   &(local_1c8.obj_)->elems_,(ElemDesc **)local_208,&local_1c8);
        pFVar32 = (Func *)&pFVar32->type_;
      } while (pFVar32 != pFVar10);
    }
    pFVar32 = (Func *)((local_198.obj_)->desc_).datas.
                      super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    pFVar10 = (Func *)((local_198.obj_)->desc_).datas.
                      super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar32 != pFVar10) {
      do {
        local_208._0_8_ = pFVar32;
        std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
        emplace_back<wabt::interp::DataDesc_const*>
                  ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                   &(local_1c8.obj_)->datas_,(DataDesc **)local_208);
        pFVar32 = (Func *)&(pFVar32->super_Extern).super_Object.self_;
      } while (pFVar32 != pFVar10);
    }
    local_1a0 = (RefVec *)(ulong)(store->features_).bulk_memory_enabled_;
    local_150 = store;
    do {
      pEVar11 = ((local_1c8.obj_)->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src = ((local_1c8.obj_)->elems_).
                 super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                 ._M_impl.super__Vector_impl_data._M_start; src != pEVar11; src = src + 1) {
        pEVar12 = src->desc_;
        if (pEVar12->mode == Declared) {
          pRVar21 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish != pRVar21) {
            (src->elements_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = pRVar21;
          }
        }
        else if (pEVar12->mode == Active) {
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)&local_1e8.v128_,store,
                     (Ref)((local_1c8.obj_)->tables_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pEVar12->table_index].index);
          store_00 = store;
          VVar38 = ResolveInitExpr(local_1c8.obj_,store,pEVar12->offset);
          uVar29 = VVar38.i64_;
          uVar30 = (ulong)((long)(src->elements_).
                                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(src->elements_).
                                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3;
          if ((int)local_1a0 == 0) {
            uVar22 = (long)*(pointer *)(local_1e8.i64_ + 0x70) -
                     (long)(((RefVec *)(local_1e8.i64_ + 0x68))->
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3;
            uVar30 = uVar30 & 0xffffffff;
            RVar19.enum_ = (Enum)(uVar22 - uVar30 < (uVar29 & 0xffffffff) || uVar22 < uVar30);
          }
          else {
            RVar19 = Table::Init((Table *)local_1e8.i64_,store_00,VVar38.i32_,src,0,(u32)uVar30);
            pRVar21 = (src->elements_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish != pRVar21) {
              (src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar21;
            }
          }
          if (RVar19.enum_ == Error) {
            StringPrintf_abi_cxx11_
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,
                       "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                       ,uVar29 & 0xffffffff,
                       ((ulong)((long)(src->elements_).
                                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(src->elements_).
                                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff) +
                       (uVar29 & 0xffffffff),
                       (ulong)(*(long *)(local_1e8.i64_ + 0x70) - *(long *)(local_1e8.i64_ + 0x68))
                       >> 3);
            local_178.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_178.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_178.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            Store::
            Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                      (&local_148,store,store,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,&local_178);
            local_158->obj_ = local_148.obj_;
            local_158->store_ = local_148.store_;
            local_158->root_index_ = local_148.root_index_;
            goto LAB_00247957;
          }
          if (local_1e8.i64_ != 0) {
            FreeList<wabt::interp::Ref>::Delete
                      ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
            local_1e8 = (Value)ZEXT816(0);
            local_1d8 = 0;
          }
        }
      }
      pDVar13 = ((local_1c8.obj_)->datas_).
                super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar37 = ((local_1c8.obj_)->datas_).
                     super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar37 != pDVar13;
          pDVar37 = pDVar37 + 1) {
        pDVar14 = pDVar37->desc_;
        if (pDVar14->mode == Declared) {
          pDVar37->size_ = 0;
        }
        else if (pDVar14->mode == Active) {
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)&local_1e8.v128_,store,
                     (Ref)((local_1c8.obj_)->memories_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pDVar14->memory_index].index);
          VVar38 = ResolveInitExpr(local_1c8.obj_,store,pDVar14->offset);
          uVar30 = VVar38.i64_;
          uVar22 = (ulong)pDVar37->size_;
          uVar29 = (uVar30 & 0xffffffff) + uVar22;
          uVar34 = *(long *)(local_1e8.i64_ + 0x70) - *(long *)(local_1e8.i64_ + 0x68);
          if ((int)local_1a0 != 0) {
            if ((uVar22 != 0) && (uVar29 <= uVar34)) {
              memmove((void *)(*(long *)(local_1e8.i64_ + 0x68) + (uVar30 & 0xffffffff)),
                      (pDVar37->desc_->data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar22);
            }
            pDVar37->size_ = 0;
          }
          if (uVar34 < uVar29) {
            StringPrintf_abi_cxx11_
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,
                       "out of bounds memory access: data segment is out of bounds: [%u, %lu) >= max value %u"
                       ,uVar30 & 0xffffffff,(ulong)pDVar37->size_ + (uVar30 & 0xffffffff),
                       (ulong)(uint)(*(int *)(local_1e8.i64_ + 0x70) -
                                    *(int *)(local_1e8.i64_ + 0x68)));
            local_178.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_178.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_178.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            Store::
            Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                      (&local_148,local_150,local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,&local_178);
            local_158->obj_ = local_148.obj_;
            local_158->store_ = local_148.store_;
            local_158->root_index_ = local_148.root_index_;
LAB_00247957:
            local_148.root_index_ = 0;
            local_148.store_ = (Store *)0x0;
            local_148.obj_ = (Trap *)0x0;
            if (local_178.
                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_178.
                              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((Func *)local_208._0_8_ != (Func *)(local_208 + 0x10)) {
              operator_delete((void *)local_208._0_8_);
            }
            local_1a8->obj_ = (Instance *)0x0;
            local_1a8->store_ = (Store *)0x0;
            local_1a8->root_index_ = 0;
            if (local_1e8.i64_ != 0) {
              FreeList<wabt::interp::Ref>::Delete
                        ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
              local_1e8 = (Value)ZEXT816(0);
              local_1d8 = 0;
            }
            goto LAB_002479b6;
          }
          store = local_150;
          if (local_1e8.i64_ != 0) {
            FreeList<wabt::interp::Ref>::Delete
                      ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
            local_1e8 = (Value)ZEXT816(0);
            local_1d8 = 0;
            store = local_150;
          }
        }
      }
      iVar18 = (int)local_1a0;
      local_1a0 = (RefVec *)(ulong)(iVar18 + 1);
    } while (iVar18 == 0);
    pSVar35 = ((local_198.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar15 = ((local_198.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pSVar35 != pSVar15) {
      out_trap_00 = local_158;
      do {
        RefPtr<wabt::interp::Func>::RefPtr
                  ((RefPtr<wabt::interp::Func> *)local_208,store,
                   (Ref)((local_1c8.obj_)->funcs_).
                        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                        _M_impl.super__Vector_impl_data._M_start[pSVar35->func_index].index);
        local_1d8 = 0;
        local_1e8 = (Value)ZEXT816(0);
        local_148.root_index_ = 0;
        local_148.obj_ = (Trap *)0x0;
        local_148.store_ = (Store *)0x0;
        RVar19 = Func::Call((Func *)local_208._0_8_,store,(Values *)&local_148,
                            (Values *)&local_1e8.v128_,out_trap_00,(Stream *)0x0);
        if (local_148.obj_ != (Trap *)0x0) {
          operator_delete(local_148.obj_);
        }
        if (RVar19.enum_ == Error) {
          local_1a8->obj_ = (Instance *)0x0;
          local_1a8->store_ = (Store *)0x0;
          local_1a8->root_index_ = 0;
          if ((void *)local_1e8.i64_ != (void *)0x0) {
            operator_delete((void *)local_1e8.i64_);
          }
          if ((Func *)local_208._0_8_ != (Func *)0x0) {
            FreeList<wabt::interp::Ref>::Delete
                      ((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_);
            local_208._0_8_ = (Func *)0x0;
            local_208._8_8_ = (Store *)0x0;
            local_208._16_8_ = 0;
          }
          goto LAB_002479b6;
        }
        if ((void *)local_1e8.i64_ != (void *)0x0) {
          operator_delete((void *)local_1e8.i64_);
        }
        out_trap_00 = local_158;
        if ((Func *)local_208._0_8_ != (Func *)0x0) {
          FreeList<wabt::interp::Ref>::Delete((RootList *)(local_208._8_8_ + 0x68),local_208._16_8_)
          ;
          local_208._0_8_ = (Func *)0x0;
          local_208._8_8_ = (Store *)0x0;
          local_208._16_8_ = 0;
        }
        pSVar35 = pSVar35 + 1;
      } while (pSVar35 != pSVar15);
    }
    local_1a8->obj_ = local_1c8.obj_;
    local_1a8->store_ = local_1c8.store_;
    local_1a8->root_index_ = local_1c8.root_index_;
    local_1c8.obj_ = (Instance *)0x0;
    local_1c8.store_ = (Store *)0x0;
    local_1c8.root_index_ = 0;
  }
LAB_002479b6:
  if (local_1c8.obj_ != (Instance *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_1c8.store_)->roots_,local_1c8.root_index_);
    local_1c8.obj_ = (Instance *)0x0;
    local_1c8.store_ = (Store *)0x0;
    local_1c8.root_index_ = 0;
  }
  if (local_198.obj_ != (Module *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_198.store_)->roots_,local_198.root_index_);
  }
  return local_1a8;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Event:  inst->events_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    inst->globals_.push_back(
        Global::New(store, desc.type, inst->ResolveInitExpr(store, desc.init))
            .ref());
  }

  // Events.
  for (auto&& desc : mod->desc().events) {
    inst->events_.push_back(Event::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports){
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Event:  ref = inst->events_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds memory access: data segment is "
                           "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                           offset, u64{offset} + segment.size(),
                           memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}